

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultTestListener.cpp
# Opt level: O3

TestListener * rc::detail::globalTestListener(void)

{
  int iVar1;
  Configuration *config;
  
  if (globalTestListener()::listener == '\0') {
    iVar1 = __cxa_guard_acquire(&globalTestListener()::listener);
    if (iVar1 != 0) {
      config = configuration();
      makeDefaultTestListener((detail *)&globalTestListener::listener,config,(ostream *)&std::cerr);
      __cxa_atexit(std::
                   unique_ptr<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>_>
                   ::~unique_ptr,&globalTestListener::listener,&__dso_handle);
      __cxa_guard_release(&globalTestListener()::listener);
    }
  }
  return (TestListener *)
         (__uniq_ptr_impl<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>_>)
         globalTestListener::listener._M_t.
         super___uniq_ptr_impl<rc::detail::TestListener,_std::default_delete<rc::detail::TestListener>_>
         ._M_t.
         super__Tuple_impl<0UL,_rc::detail::TestListener_*,_std::default_delete<rc::detail::TestListener>_>
         .super__Head_base<0UL,_rc::detail::TestListener_*,_false>._M_head_impl;
}

Assistant:

TestListener &globalTestListener() {
  static const auto listener =
      makeDefaultTestListener(configuration(), std::cerr);
  return *listener;
}